

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testModBus(void)

{
  char *pcVar1;
  C *pCVar2;
  String s_3_5;
  String s_1_5;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_98;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_78;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  Time local_2c;
  
  printf("crc16        = %04x\ncrc16 modbus = %04x\ncrc16 xmodem = %04x\ncrc16 ffff   = %04x\n",
         0x1e84,0x584,0x7ef6,0x70e6);
  axl::sys::Time::setTimestampImpl((Time *)&local_78,0x1e84,false,0);
  local_98.m_length._0_1_ = 0;
  local_98.m_length._1_7_ = 0;
  local_98.m_isNullTerminated = false;
  local_98.m_p = (C *)0x0;
  local_98.m_hdr._0_1_ = 0;
  local_98.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_98,(BufHdr *)0x0);
  local_98.m_p = "%s.%l.%c";
  local_98.m_length._0_1_ = 8;
  local_98.m_length._1_7_ = 0;
  local_98.m_isNullTerminated = true;
  axl::sys::Time::format((String *)&local_50,(Time *)&local_78,&local_98);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
  axl::sys::Time::setTimestampImpl(&local_2c,0x4735,false,0);
  local_78.m_length._0_1_ = 0;
  local_78.m_length._1_7_ = 0;
  local_78.m_isNullTerminated = false;
  local_78.m_p = (C *)0x0;
  local_78.m_hdr._0_1_ = 0;
  local_78.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_78,(BufHdr *)0x0);
  local_78.m_p = "%s.%l.%c";
  local_78.m_length._0_1_ = 8;
  local_78.m_length._1_7_ = 0;
  local_78.m_isNullTerminated = true;
  axl::sys::Time::format((String *)&local_98,&local_2c,&local_78);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_78);
  pCVar2 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  if (local_50.m_length != 0) {
    pCVar2 = local_50.m_p;
  }
  pcVar1 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  if (CONCAT71(local_98.m_length._1_7_,(undefined1)local_98.m_length) != 0) {
    pcVar1 = local_98.m_p;
  }
  printf("t_1_5 = %s\nt_3_5 = %s\n",pCVar2,pcVar1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
  return;
}

Assistant:

void
testModBus() {
	uint8_t packet[] = {
		0x01, 0x03, 0x00, 0x30, 0x00, 0x01, // 0x00, 0x00,
	};

	printf(
		"crc16        = %04x\n"
		"crc16 modbus = %04x\n"
		"crc16 xmodem = %04x\n"
		"crc16 ffff   = %04x\n",
		crc16_ansi(packet, sizeof(packet), 0),
		crc16_ansi(packet, sizeof(packet), 0xffff),
		crc16_ccit(packet, sizeof(packet), 0),
		crc16_ccit(packet, sizeof(packet), 0xffff)
	);

	uint_t baud = 19200;

	uint64_t timeout_1_5;
	uint64_t timeout_3_5;

	if (baud > 19200) {
		timeout_1_5 = 7500;
		timeout_3_5 = 17500;
	} else {
		timeout_1_5 = 150000000 / baud;
		timeout_3_5 = 350000000 / baud;
	}

	sl::String s_1_5 = sys::Time(timeout_1_5, false).format("%s.%l.%c");
	sl::String s_3_5 = sys::Time(timeout_3_5, false).format("%s.%l.%c");

	printf("t_1_5 = %s\nt_3_5 = %s\n", s_1_5.sz(), s_3_5.sz());
}